

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_pack.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::StructPackStats(duckdb *this,ClientContext *context,FunctionStatisticsInput *input)

{
  vector<duckdb::BaseStatistics,_true> *this_00;
  reference new_stats;
  idx_t i;
  ulong __n;
  LogicalType LStack_98;
  BaseStatistics struct_stats;
  
  this_00 = input->child_stats;
  LogicalType::LogicalType(&LStack_98,&(input->expr->super_Expression).return_type);
  StructStats::CreateUnknown(&struct_stats,&LStack_98);
  LogicalType::~LogicalType(&LStack_98);
  for (__n = 0; __n < (ulong)(((long)(this_00->
                                     super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                     ).
                                     super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this_00->
                                    super_vector<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                    ).
                                    super__Vector_base<duckdb::BaseStatistics,_std::allocator<duckdb::BaseStatistics>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x58);
      __n = __n + 1) {
    new_stats = vector<duckdb::BaseStatistics,_true>::get<true>(this_00,__n);
    StructStats::SetChildStats(&struct_stats,__n,new_stats);
  }
  BaseStatistics::ToUnique((BaseStatistics *)this);
  BaseStatistics::~BaseStatistics(&struct_stats);
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

unique_ptr<BaseStatistics> StructPackStats(ClientContext &context, FunctionStatisticsInput &input) {
	auto &child_stats = input.child_stats;
	auto &expr = input.expr;
	auto struct_stats = StructStats::CreateUnknown(expr.return_type);
	for (idx_t i = 0; i < child_stats.size(); i++) {
		StructStats::SetChildStats(struct_stats, i, child_stats[i]);
	}
	return struct_stats.ToUnique();
}